

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcMem.c
# Opt level: O2

Wlc_Ntk_t * Wlc_NtkMemBlast(Wlc_Ntk_t *p)

{
  Vec_Int_t *pVVar1;
  int iVar2;
  int iVar3;
  Vec_Int_t *p_00;
  Wlc_Ntk_t *pNew;
  Wlc_Obj_t *pWVar4;
  Wlc_Obj_t *pObj;
  Vec_Int_t *pVVar5;
  int *__dest;
  char *pcVar6;
  int iVar7;
  size_t __size;
  
  Wlc_NtkCleanCopy(p);
  p_00 = Vec_IntAlloc(100);
  pNew = Wlc_NtkAlloc(p->pName,p->nObjsAlloc);
  iVar7 = p->fAsyncRst;
  iVar3 = p->fMemPorts;
  iVar2 = p->fEasyFfs;
  pNew->fSmtLib = p->fSmtLib;
  pNew->fAsyncRst = iVar7;
  pNew->fMemPorts = iVar3;
  pNew->fEasyFfs = iVar2;
  for (iVar7 = 0; iVar7 < (p->vCis).nSize; iVar7 = iVar7 + 1) {
    pWVar4 = Wlc_NtkCi(p,iVar7);
    Wlc_ObjDup(pNew,p,(int)(((long)pWVar4 - (long)p->pObjs) / 0x18),p_00);
  }
  for (iVar7 = 0; iVar3 = (p->vCos).nSize, iVar7 < iVar3; iVar7 = iVar7 + 1) {
    pWVar4 = Wlc_NtkCo(p,iVar7);
    Wlc_NtkMemBlast_rec(pNew,p,(int)(((long)pWVar4 - (long)p->pObjs) / 0x18),p_00);
  }
  for (iVar7 = 0; iVar7 < iVar3; iVar7 = iVar7 + 1) {
    pWVar4 = Wlc_NtkCo(p,iVar7);
    pObj = Wlc_ObjCopyObj(pNew,p,pWVar4);
    Wlc_ObjSetCo(pNew,pObj,*(uint *)pWVar4 >> 10 & 1);
    iVar3 = (p->vCos).nSize;
  }
  pVVar1 = p->vInits;
  if (pVVar1 != (Vec_Int_t *)0x0) {
    pVVar5 = (Vec_Int_t *)malloc(0x10);
    iVar7 = pVVar1->nSize;
    pVVar5->nSize = iVar7;
    pVVar5->nCap = iVar7;
    if ((long)iVar7 == 0) {
      __size = 0;
      __dest = (int *)0x0;
    }
    else {
      __size = (long)iVar7 << 2;
      __dest = (int *)malloc(__size);
    }
    pVVar5->pArray = __dest;
    memcpy(__dest,pVVar1->pArray,__size);
    pNew->vInits = pVVar5;
  }
  if (p->pInits != (char *)0x0) {
    pcVar6 = Abc_UtilStrsav(p->pInits);
    pNew->pInits = pcVar6;
  }
  Vec_IntFree(p_00);
  if (p->pSpec != (char *)0x0) {
    pcVar6 = Abc_UtilStrsav(p->pSpec);
    pNew->pSpec = pcVar6;
  }
  return pNew;
}

Assistant:

Wlc_Ntk_t * Wlc_NtkMemBlast( Wlc_Ntk_t * p )
{
    Wlc_Ntk_t * pNew;
    Wlc_Obj_t * pObj;
    Vec_Int_t * vFanins;
    int i;
    Wlc_NtkCleanCopy( p );
    vFanins = Vec_IntAlloc( 100 );
    pNew = Wlc_NtkAlloc( p->pName, p->nObjsAlloc );
    pNew->fSmtLib = p->fSmtLib;
    pNew->fAsyncRst = p->fAsyncRst;
    pNew->fMemPorts = p->fMemPorts;
    pNew->fEasyFfs = p->fEasyFfs;
    Wlc_NtkForEachCi( p, pObj, i )
        Wlc_ObjDup( pNew, p, Wlc_ObjId(p, pObj), vFanins );
    Wlc_NtkForEachCo( p, pObj, i )
        Wlc_NtkMemBlast_rec( pNew, p, Wlc_ObjId(p, pObj), vFanins );
    Wlc_NtkForEachCo( p, pObj, i )
        Wlc_ObjSetCo( pNew, Wlc_ObjCopyObj(pNew, p, pObj), pObj->fIsFi );
    if ( p->vInits )
    pNew->vInits = Vec_IntDup( p->vInits );
    if ( p->pInits )
    pNew->pInits = Abc_UtilStrsav( p->pInits );
    Vec_IntFree( vFanins );
    if ( p->pSpec )
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    return pNew;
}